

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

int BZ2_bzCompressInit(bz_stream *strm,int blockSize100k,int verbosity,int workFactor)

{
  code *pcVar1;
  undefined8 *puVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = -2;
  if (((uint)workFactor < 0xfb && strm != (bz_stream *)0x0) && 0xfffffff6 < blockSize100k - 10U) {
    iVar5 = 0x1e;
    if (workFactor != 0) {
      iVar5 = workFactor;
    }
    pcVar1 = strm->bzalloc;
    if (pcVar1 == (_func_void_ptr_void_ptr_int_int *)0x0) {
      pcVar1 = default_bzalloc;
      strm->bzalloc = default_bzalloc;
    }
    if (strm->bzfree == (_func_void_void_ptr_void_ptr *)0x0) {
      strm->bzfree = default_bzfree;
    }
    puVar2 = (undefined8 *)(*pcVar1)(strm->opaque,0xd9d8,1);
    iVar6 = -3;
    if (puVar2 != (undefined8 *)0x0) {
      *puVar2 = strm;
      puVar2[3] = 0;
      puVar2[4] = 0;
      puVar2[5] = 0;
      pvVar3 = (*strm->bzalloc)(strm->opaque,blockSize100k * 400000,1);
      puVar2[3] = pvVar3;
      pvVar3 = (*strm->bzalloc)(strm->opaque,blockSize100k * 400000 + 0x88,1);
      puVar2[4] = pvVar3;
      pvVar4 = (*strm->bzalloc)(strm->opaque,0x40004,1);
      puVar2[5] = pvVar4;
      pvVar3 = (void *)puVar2[3];
      if (pvVar3 != (void *)0x0) {
        if (pvVar4 != (void *)0x0 && puVar2[4] != 0) {
          puVar2[1] = 0x200000002;
          *(undefined4 *)((long)puVar2 + 0x28c) = 0;
          *(int *)(puVar2 + 0x53) = blockSize100k;
          *(int *)(puVar2 + 0xe) = blockSize100k * 100000 + -0x13;
          *(int *)(puVar2 + 0x52) = verbosity;
          *(int *)(puVar2 + 0xb) = iVar5;
          puVar2[8] = puVar2[4];
          puVar2[9] = pvVar3;
          puVar2[10] = 0;
          puVar2[7] = pvVar3;
          strm->state = puVar2;
          strm->total_in_lo32 = 0;
          strm->total_in_hi32 = 0;
          strm->total_out_lo32 = 0;
          strm->total_out_hi32 = 0;
          *(undefined8 *)((long)puVar2 + 0x5c) = 0x100;
          *(undefined4 *)((long)puVar2 + 0x6c) = 0;
          *(undefined8 *)((long)puVar2 + 0x74) = 0;
          *(undefined4 *)(puVar2 + 0x51) = 0xffffffff;
          memset(puVar2 + 0x10,0,0x100);
          *(undefined4 *)((long)puVar2 + 0x294) = 1;
          return 0;
        }
        (*strm->bzfree)(strm->opaque,pvVar3);
      }
      if ((void *)puVar2[4] != (void *)0x0) {
        (*strm->bzfree)(strm->opaque,(void *)puVar2[4]);
      }
      if ((void *)puVar2[5] != (void *)0x0) {
        (*strm->bzfree)(strm->opaque,(void *)puVar2[5]);
      }
      (*strm->bzfree)(strm->opaque,puVar2);
    }
  }
  return iVar6;
}

Assistant:

int BZ_API(BZ2_bzCompressInit)
                    ( bz_stream* strm,
                     int        blockSize100k,
                     int        verbosity,
                     int        workFactor )
{
   Int32   n;
   EState* s;

   if (!bz_config_ok()) return BZ_CONFIG_ERROR;

   if (strm == NULL ||
       blockSize100k < 1 || blockSize100k > 9 ||
       workFactor < 0 || workFactor > 250)
     return BZ_PARAM_ERROR;

   if (workFactor == 0) workFactor = 30;
   if (strm->bzalloc == NULL) strm->bzalloc = default_bzalloc;
   if (strm->bzfree == NULL) strm->bzfree = default_bzfree;

   s = BZALLOC( sizeof(EState) );
   if (s == NULL) return BZ_MEM_ERROR;
   s->strm = strm;

   s->arr1 = NULL;
   s->arr2 = NULL;
   s->ftab = NULL;

   n       = 100000 * blockSize100k;
   s->arr1 = BZALLOC( n                  * sizeof(UInt32) );
   s->arr2 = BZALLOC( (n+BZ_N_OVERSHOOT) * sizeof(UInt32) );
   s->ftab = BZALLOC( 65537              * sizeof(UInt32) );

   if (s->arr1 == NULL || s->arr2 == NULL || s->ftab == NULL) {
      if (s->arr1 != NULL) BZFREE(s->arr1);
      if (s->arr2 != NULL) BZFREE(s->arr2);
      if (s->ftab != NULL) BZFREE(s->ftab);
      if (s       != NULL) BZFREE(s);
      return BZ_MEM_ERROR;
   }

   s->blockNo           = 0;
   s->state             = BZ_S_INPUT;
   s->mode              = BZ_M_RUNNING;
   s->combinedCRC       = 0;
   s->blockSize100k     = blockSize100k;
   s->nblockMAX         = 100000 * blockSize100k - 19;
   s->verbosity         = verbosity;
   s->workFactor        = workFactor;

   s->block             = (UChar*)s->arr2;
   s->mtfv              = (UInt16*)s->arr1;
   s->zbits             = NULL;
   s->ptr               = (UInt32*)s->arr1;

   strm->state          = s;
   strm->total_in_lo32  = 0;
   strm->total_in_hi32  = 0;
   strm->total_out_lo32 = 0;
   strm->total_out_hi32 = 0;
   init_RL ( s );
   prepare_new_block ( s );
   return BZ_OK;
}